

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_do_button_text_image
              (nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_image img,char *str,int len,
              nk_flags align,nk_button_behavior behavior,nk_style_button *style,nk_user_font *font,
              nk_input *in)

{
  float fVar1;
  uint state_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  nk_style_item *pnVar5;
  nk_color *pnVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  nk_rect r;
  nk_rect content;
  nk_rect local_a8;
  nk_text local_98;
  undefined1 local_88 [8];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [8];
  undefined4 uStack_70;
  undefined4 uStack_6c;
  nk_rect local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_a8 = bounds;
  if (style == (nk_style_button *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4d68,
                  "int nk_do_button_text_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, struct nk_image, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4d69,
                  "int nk_do_button_text_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, struct nk_image, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (font == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4d6a,
                  "int nk_do_button_text_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, struct nk_image, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x4d6b,
                  "int nk_do_button_text_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, struct nk_image, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (str == (char *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = nk_do_button(state,out,bounds,style,in,behavior,&local_68);
    fVar8 = (style->padding).y;
    fVar9 = local_a8.h - (fVar8 + fVar8);
    if ((align & 1) == 0) {
      fVar7 = (style->padding).x;
      local_78._0_4_ = fVar7 + fVar7 + local_a8.x;
    }
    else {
      fVar7 = (style->padding).x;
      fVar7 = (local_a8.x + local_a8.w) - (fVar7 + fVar7 + fVar9);
      local_78._0_4_ = 0.0;
      if (0.0 <= fVar7) {
        local_78._0_4_ = fVar7;
      }
    }
    fVar7 = (style->image_padding).x;
    fVar1 = (style->image_padding).y;
    local_78._0_4_ = (float)local_78._0_4_ + fVar7;
    fVar8 = local_a8.y + fVar8 + fVar1;
    local_88._0_4_ = fVar9 - (fVar7 + fVar7);
    fVar9 = fVar9 - (fVar1 + fVar1);
    uStack_70 = 0;
    uStack_80 = 0;
    uStack_6c = 0;
    uStack_7c = 0;
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      _local_78 = ZEXT416((uint)local_78._0_4_);
      _local_88 = ZEXT416((uint)local_88._0_4_);
      local_48 = ZEXT416((uint)fVar8);
      local_58 = ZEXT416((uint)fVar9);
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
      uStack_70 = local_78._4_4_;
      uStack_80 = local_88._4_4_;
      fVar8 = (float)local_48._0_4_;
      uStack_6c = local_48._4_4_;
      fVar9 = (float)local_58._0_4_;
      uStack_7c = local_58._4_4_;
    }
    local_78._4_4_ = fVar8;
    local_88._4_4_ = fVar9;
    state_00 = *state;
    pnVar5 = nk_draw_button(out,&local_a8,state_00,style);
    pnVar6 = &style->text_background;
    if (pnVar5->type == NK_STYLE_ITEM_COLOR) {
      pnVar6 = (nk_color *)&pnVar5->data;
    }
    local_98.background = *pnVar6;
    if ((state_00 & 0x10) == 0) {
      if ((state_00 & 0x20) == 0) {
        local_98.text = style->text_normal;
      }
      else {
        local_98.text = style->text_active;
      }
    }
    else {
      local_98.text = style->text_hover;
    }
    local_98.padding.x = 0.0;
    local_98.padding.y = 0.0;
    nk_widget_text(out,local_68,str,len,&local_98,0x12,font);
    auVar3 = _local_78;
    auVar2 = _local_88;
    r.w = (float)local_88._0_4_;
    r.h = (float)local_88._4_4_;
    r.x = (float)local_78._0_4_;
    r.y = (float)local_78._4_4_;
    _local_88 = auVar2;
    _local_78 = auVar3;
    nk_draw_image(out,r,&img,(nk_color)0xffffffff);
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
  }
  return iVar4;
}

Assistant:

NK_LIB int
nk_do_button_text_image(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect bounds,
    struct nk_image img, const char* str, int len, nk_flags align,
    enum nk_button_behavior behavior, const struct nk_style_button *style,
    const struct nk_user_font *font, const struct nk_input *in)
{
    int ret;
    struct nk_rect icon;
    struct nk_rect content;

    NK_ASSERT(style);
    NK_ASSERT(state);
    NK_ASSERT(font);
    NK_ASSERT(out);
    if (!out || !font || !style || !str)
        return nk_false;

    ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
    icon.y = bounds.y + style->padding.y;
    icon.w = icon.h = bounds.h - 2 * style->padding.y;
    if (align & NK_TEXT_ALIGN_LEFT) {
        icon.x = (bounds.x + bounds.w) - (2 * style->padding.x + icon.w);
        icon.x = NK_MAX(icon.x, 0);
    } else icon.x = bounds.x + 2 * style->padding.x;

    icon.x += style->image_padding.x;
    icon.y += style->image_padding.y;
    icon.w -= 2 * style->image_padding.x;
    icon.h -= 2 * style->image_padding.y;

    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_button_text_image(out, &bounds, &content, &icon, *state, style, str, len, font, &img);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return ret;
}